

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part_specifier.cpp
# Opt level: O0

DatePartSpecifier duckdb::GetDatePartSpecifier(string *specifier)

{
  undefined8 uVar1;
  bool bVar2;
  string *in_RDI;
  DatePartSpecifier *unaff_retaddr;
  string *in_stack_00000008;
  DatePartSpecifier result;
  string local_68 [55];
  allocator local_31;
  string local_30 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  string *in_stack_ffffffffffffffe8;
  undefined7 in_stack_fffffffffffffff0;
  DatePartSpecifier in_stack_fffffffffffffff7;
  
  bVar2 = TryGetDatePartSpecifier(in_stack_00000008,unaff_retaddr);
  if (!bVar2) {
    uVar1 = __cxa_allocate_exception(0x10);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_30,"extract specifier \"%s\" not recognized",&local_31);
    ::std::__cxx11::string::string(local_68,in_RDI);
    ConversionException::ConversionException<std::__cxx11::string>
              ((ConversionException *)CONCAT17(in_stack_fffffffffffffff7,in_stack_fffffffffffffff0),
               in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
    __cxa_throw(uVar1,&ConversionException::typeinfo,ConversionException::~ConversionException);
  }
  return in_stack_fffffffffffffff7;
}

Assistant:

DatePartSpecifier GetDatePartSpecifier(const string &specifier) {
	DatePartSpecifier result;
	if (!TryGetDatePartSpecifier(specifier, result)) {
		throw ConversionException("extract specifier \"%s\" not recognized", specifier);
	}
	return result;
}